

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderPixelEllipsis(ImDrawList *draw_list,ImVec2 pos,int count,ImU32 col)

{
  ImDrawList *this;
  ImVec2 local_40;
  ImVec2 local_38;
  int local_30;
  float local_2c;
  int dot_n;
  float font_scale;
  ImFont *font;
  ImU32 col_local;
  int count_local;
  ImDrawList *draw_list_local;
  ImVec2 pos_local;
  
  _dot_n = draw_list->_Data->Font;
  local_2c = draw_list->_Data->FontSize / _dot_n->FontSize;
  draw_list_local._4_4_ = pos.y;
  draw_list_local._0_4_ = pos.x;
  draw_list_local =
       (ImDrawList *)
       CONCAT44((float)(int)((_dot_n->Ascent * local_2c + (_dot_n->DisplayOffset).y + 0.5) - 1.0) +
                draw_list_local._4_4_,draw_list_local._0_4_);
  font._0_4_ = col;
  font._4_4_ = count;
  _col_local = draw_list;
  for (local_30 = 0; this = _col_local, local_30 < font._4_4_; local_30 = local_30 + 1) {
    ImVec2::ImVec2(&local_38,(float)local_30 + (float)local_30 + draw_list_local._0_4_,
                   draw_list_local._4_4_);
    ImVec2::ImVec2(&local_40,(float)local_30 + (float)local_30 + draw_list_local._0_4_ + 1.0,
                   draw_list_local._4_4_ + 1.0);
    ImDrawList::AddRectFilled(this,&local_38,&local_40,(ImU32)font,0.0,0xf);
  }
  return;
}

Assistant:

void ImGui::RenderPixelEllipsis(ImDrawList* draw_list, ImVec2 pos, int count, ImU32 col)
{
    ImFont* font = draw_list->_Data->Font;
    const float font_scale = draw_list->_Data->FontSize / font->FontSize;
    pos.y += (float)(int)(font->DisplayOffset.y + font->Ascent * font_scale + 0.5f - 1.0f);
    for (int dot_n = 0; dot_n < count; dot_n++)
        draw_list->AddRectFilled(ImVec2(pos.x + dot_n * 2.0f, pos.y), ImVec2(pos.x + dot_n * 2.0f + 1.0f, pos.y + 1.0f), col);
}